

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicMinCase::getInputs
          (ShaderAtomicMinCase *this,int numValues,int stride,void *inputs)

{
  deUint32 seed;
  int iVar1;
  int min;
  int max;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  Random rnd;
  
  seed = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                      m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  bVar4 = (this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP;
  min = -1000;
  if (bVar4) {
    min = -100;
  }
  max = 1000;
  if (bVar4) {
    max = 100;
  }
  uVar3 = 0;
  if ((this->super_ShaderAtomicOpCase).m_type != TYPE_INT) {
    min = 0;
  }
  uVar2 = (ulong)(uint)numValues;
  if (numValues < 1) {
    uVar2 = uVar3;
  }
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    iVar1 = de::Random::getInt(&rnd,min,max);
    *(int *)((long)inputs + (long)(int)uVar3) = iVar1;
    uVar3 = (ulong)(uint)((int)uVar3 + stride);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random	rnd			(deStringHash(getName()));
		const bool	isSigned	= m_type == TYPE_INT;
		const int	maxVal		= m_precision == PRECISION_LOWP ? 100 : 1000;
		const int	minVal		= isSigned ? -maxVal : 0;

		for (int valNdx = 0; valNdx < numValues; valNdx++)
			*(int*)((deUint8*)inputs + stride*valNdx) = rnd.getInt(minVal, maxVal);
	}